

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

TrackPosition * __thiscall mkvparser::CuePoint::Find(CuePoint *this,Track *pTrack)

{
  TrackPosition *pTVar1;
  long lVar2;
  Track *in_RSI;
  long in_RDI;
  TrackPosition *p;
  TrackPosition *j;
  TrackPosition *i;
  longlong n;
  TrackPosition *local_28;
  TrackPosition *local_8;
  
  if (in_RSI == (Track *)0x0) {
    local_8 = (TrackPosition *)0x0;
  }
  else {
    lVar2 = Track::GetNumber(in_RSI);
    pTVar1 = *(TrackPosition **)(in_RDI + 0x20);
    do {
      local_28 = pTVar1;
      if (local_28 == *(TrackPosition **)(in_RDI + 0x20) + *(long *)(in_RDI + 0x28)) {
        return (TrackPosition *)0x0;
      }
      pTVar1 = local_28 + 1;
    } while (local_28->m_track != lVar2);
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

const CuePoint::TrackPosition* CuePoint::Find(const Track* pTrack) const {
  if (pTrack == NULL) {
    return NULL;
  }

  const long long n = pTrack->GetNumber();

  const TrackPosition* i = m_track_positions;
  const TrackPosition* const j = i + m_track_positions_count;

  while (i != j) {
    const TrackPosition& p = *i++;

    if (p.m_track == n)
      return &p;
  }

  return NULL;  // no matching track number found
}